

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

void lj_snap_replay(jit_State *J,GCtrace *T)

{
  IRIns *pIVar1;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  undefined4 uVar6;
  SnapShot *pSVar7;
  IRIns *pIVar8;
  bool bVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  IRRef1 IVar13;
  IRRef1 IVar14;
  uint uVar15;
  uint uVar16;
  TRef TVar17;
  TRef TVar18;
  ulong uVar19;
  IROpT IVar20;
  uint uVar21;
  ulong uVar22;
  IRIns *pIVar23;
  IRIns *pIVar24;
  IRIns *pIVar25;
  ulong uVar26;
  IRIns *pIVar27;
  uint uVar28;
  SnapEntry *map;
  bool bVar29;
  ulong local_78;
  
  pSVar7 = T->snap;
  uVar5 = J->exitno;
  map = T->snapmap + pSVar7[uVar5].mapofs;
  bVar3 = pSVar7[uVar5].nent;
  uVar19 = (ulong)bVar3;
  J->framedepth = 0;
  if (bVar3 == 0) {
    bVar29 = true;
    local_78 = 0;
  }
  else {
    bVar29 = false;
    uVar26 = 0;
    local_78 = 0;
    do {
      uVar21 = map[uVar26];
      uVar28 = uVar21 >> 0x18;
      uVar16 = uVar21 & 0xffff;
      pIVar25 = (IRIns *)((ulong)(uVar16 * 8) + (long)T->ir);
      if ((local_78 >> ((ulong)uVar21 & 0x3f) & 1) == 0) {
LAB_0015423b:
        local_78 = local_78 | 1L << ((byte)uVar21 & 0x3f);
        if (uVar16 < 0x8000) {
          uVar15 = 0;
          if (uVar21 != 0x1057fff) {
            uVar15 = snap_replay_const(J,pIVar25);
          }
        }
        else if (((pIVar25->field_0).prev & 0xff80) == 0x80) {
          bVar29 = true;
          uVar15 = uVar28;
        }
        else {
          uVar10 = 0x21;
          if ((pIVar25->field_1).o == 'G') {
            uVar10 = (pIVar25->field_0).op2 & 0x10 | 0x21;
          }
          (J->fold).ins.field_0.ot = (pIVar25->field_1).t.irt & 0x1f | 0x4700;
          *(ushort *)&(J->fold).ins = (ushort)(byte)(uVar21 >> 0x18);
          (J->fold).ins.field_0.op2 = (ushort)(uVar21 >> 0xe) & 0x40 | uVar10;
          uVar15 = lj_ir_emit(J);
        }
      }
      else {
        uVar15 = 0;
        if (uVar26 != 0) {
          uVar22 = 0;
          do {
            if ((map[uVar22] & 0xffff) == uVar16) {
              uVar15 = J->slot[map[uVar22] >> 0x18] & 0xffecffff;
              break;
            }
            uVar22 = uVar22 + 1;
          } while (uVar26 != uVar22);
        }
        if (uVar15 == 0) goto LAB_0015423b;
      }
      J->slot[uVar28] = uVar21 & 0x130000 | uVar15;
      J->framedepth = J->framedepth + (uint)(uVar28 != 1 && (uVar21 & 0x30000) != 0);
      if ((uVar21 >> 0x10 & 1) != 0) {
        J->baseslot = uVar28 + 1;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar19);
    bVar29 = !bVar29;
  }
  bVar9 = true;
  if (!bVar29) {
    uVar10 = pSVar7[uVar5].ref;
    pIVar25 = T->ir;
    uVar21 = (uint)bVar3;
    if (bVar3 == 0) {
      bVar9 = false;
    }
    else {
      uVar26 = 0;
      bVar9 = false;
      do {
        uVar16 = map[uVar26];
        pIVar1 = T->ir + (uVar16 & 0xffff);
        if ((pIVar1->field_1).r == 0xfd) {
          if (J->slot[uVar16 >> 0x18] == uVar16 >> 0x18) {
            if (T->nk <= (uint)(pIVar1->field_0).op1) {
              snap_pref(J,T,map,uVar21,local_78,(uint)(pIVar1->field_0).op1);
            }
            if (T->nk <= (uint)(pIVar1->field_0).op2) {
              snap_pref(J,T,map,uVar21,local_78,(uint)(pIVar1->field_0).op2);
            }
            bVar9 = true;
            pIVar24 = pIVar1;
            if ((pIVar1->field_1).o != 'T') {
LAB_00154407:
              pIVar27 = pIVar24;
              pIVar24 = pIVar27 + 1;
              if (pIVar24 < pIVar25 + uVar10) {
                if (*(char *)((long)pIVar27 + 0xe) == -2) {
                  if ((ulong)*(byte *)((long)pIVar27 + 0xf) == 0xff) {
                    uVar16 = *(byte *)((long)pIVar27 + 0xd) - 0x4a;
                    if ((4 < uVar16) || (uVar16 == 2)) goto LAB_00154407;
                    pIVar8 = T->ir;
                    pIVar23 = pIVar8 + (pIVar24->field_0).op1;
                    if (((pIVar23->field_1).o & 0xfe) == 0x38) {
                      pIVar23 = pIVar8 + (pIVar23->field_0).op1;
                    }
                    bVar29 = pIVar8 + (pIVar23->field_0).op1 == pIVar1;
                  }
                  else {
                    bVar29 = pIVar24 == pIVar1 + *(byte *)((long)pIVar27 + 0xf);
                  }
                  if ((bVar29) &&
                     (TVar17 = snap_pref(J,T,map,(uint)bVar3,local_78,
                                         (uint)*(ushort *)((long)pIVar27 + 10)), TVar17 == 0)) {
                    snap_pref(J,T,map,uVar21,local_78,
                              (uint)T->ir[*(ushort *)((long)pIVar27 + 10)].field_0.op1);
                  }
                }
                goto LAB_00154407;
              }
            }
          }
        }
        else if ((0x7fff < (uVar16 & 0xffff)) && (((pIVar1->field_0).prev & 0xff80) == 0x80)) {
          TVar17 = snap_pref(J,T,map,(uint)bVar3,local_78,(uint)(pIVar1->field_0).op1);
          J->slot[uVar16 >> 0x18] = TVar17;
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar19);
    }
    if ((bVar9) && (bVar3 != 0)) {
      uVar26 = 0;
      do {
        uVar22 = (ulong)(map[uVar26] & 0xffff);
        if (*(char *)((long)T->ir + uVar22 * 8 + 6) == -3) {
          uVar16 = map[uVar26] >> 0x18;
          if (J->slot[uVar16] == uVar16) {
            pIVar1 = T->ir + uVar22;
            uVar11 = (pIVar1->field_0).op1;
            if (T->nk <= (uint)uVar11) {
              TVar17 = snap_pref(J,T,map,uVar21,local_78,(uint)uVar11);
              uVar11 = (ushort)TVar17;
            }
            uVar12 = (pIVar1->field_0).op2;
            if (T->nk <= (uint)uVar12) {
              TVar17 = snap_pref(J,T,map,uVar21,local_78,(uint)uVar12);
              uVar12 = (ushort)TVar17;
            }
            if ((pIVar1->field_1).o != 'T') {
              (J->fold).ins.field_0.ot = (pIVar1->field_0).ot;
              (J->fold).ins.field_0.op1 = uVar11;
              (J->fold).ins.field_0.op2 = uVar12;
              TVar17 = lj_opt_fold(J);
              J->slot[uVar16] = TVar17;
              pIVar24 = pIVar1;
LAB_00154672:
              pIVar27 = pIVar24 + 1;
              if (pIVar27 < pIVar25 + uVar10) {
                if (*(char *)((long)pIVar24 + 0xe) != -2) goto LAB_001546fa;
                if ((ulong)*(byte *)((long)pIVar24 + 0xf) == 0xff) {
                  uVar16 = *(byte *)((long)pIVar24 + 0xd) - 0x4a;
                  if ((4 < uVar16) || (uVar16 == 2)) goto LAB_001546fa;
                  pIVar8 = T->ir;
                  pIVar23 = pIVar8 + (pIVar27->field_0).op1;
                  if (((pIVar23->field_1).o & 0xfe) == 0x38) {
                    pIVar23 = pIVar8 + (pIVar23->field_0).op1;
                  }
                  bVar29 = pIVar8 + (pIVar23->field_0).op1 == pIVar1;
                }
                else {
                  bVar29 = pIVar27 == pIVar1 + *(byte *)((long)pIVar24 + 0xf);
                }
                if (!bVar29) goto LAB_001546fa;
                pIVar23 = T->ir;
                uVar22 = (ulong)(pIVar27->field_0).op1;
                uVar11 = *(ushort *)((long)pIVar23 + uVar22 * 8 + 2);
                cVar4 = *(char *)((long)pIVar23 + uVar22 * 8 + 5);
                IVar13 = (IRRef1)TVar17;
                if (cVar4 != '>') {
                  pIVar8 = pIVar23 + uVar11;
                  if (cVar4 == '9') {
                    TVar18 = snap_replay_const(J,pIVar23 + (pIVar8->field_0).op1);
                    TVar18 = lj_ir_kslot(J,TVar18,(uint)(pIVar8->field_0).op2);
                    uVar11 = (ushort)TVar18;
                  }
                  else {
                    TVar18 = snap_replay_const(J,pIVar8);
                    uVar11 = (ushort)TVar18;
                  }
                  if ((*(byte *)((long)pIVar23 + uVar22 * 8 + 5) & 0xfe) == 0x38) {
                    uVar6 = *(undefined4 *)
                             ((long)T->ir + (ulong)pIVar23[uVar22].field_0.op1 * 8 + 2);
                    (J->fold).ins.field_0.op1 = IVar13;
                    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar6;
                    TVar18 = lj_opt_fold(J);
                    IVar13 = (IRRef1)TVar18;
                  }
                }
                (J->fold).ins.field_0.ot = *(IROpT *)((long)pIVar23 + uVar22 * 8 + 4);
                (J->fold).ins.field_0.op1 = IVar13;
                (J->fold).ins.field_0.op2 = uVar11;
                TVar18 = lj_opt_fold(J);
                IVar13 = (IRRef1)TVar18;
                TVar18 = snap_pref(J,T,map,uVar21,local_78,(uint)*(ushort *)((long)pIVar24 + 10));
                if (TVar18 == 0) {
                  TVar18 = snap_pref(J,T,map,uVar21,local_78,
                                     (uint)T->ir[*(ushort *)((long)pIVar24 + 10)].field_0.op1);
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar18;
                  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
                  TVar18 = lj_opt_fold(J);
                }
                IVar14 = (IRRef1)TVar18;
                IVar20 = *(IROpT *)((long)pIVar24 + 0xc);
                goto LAB_00154831;
              }
              goto LAB_0015461d;
            }
            (J->fold).ins.field_0.ot = (pIVar1->field_0).ot & 0xff9f;
            (J->fold).ins.field_0.op1 = uVar11;
            (J->fold).ins.field_0.op2 = uVar12;
            TVar17 = lj_opt_fold(J);
          }
          else {
            TVar17 = J->slot[J->slot[uVar16]];
          }
          J->slot[uVar16] = TVar17;
        }
LAB_0015461d:
      } while ((bVar9) && (uVar26 = uVar26 + 1, uVar26 < uVar19));
    }
    bVar9 = !bVar9;
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = (uint)pSVar7[uVar5].nslots - J->baseslot;
  lj_snap_add(J);
  if (!bVar9) {
    (J->fold).ins.field_0.ot = 0xf80;
    (J->fold).ins.field_1.op12 = 0;
    lj_ir_emit(J);
    return;
  }
  return;
LAB_001546fa:
  pcVar2 = (char *)((long)pIVar24 + 0xd);
  pIVar24 = pIVar27;
  if ((*pcVar2 == 'Z') && ((pIVar1->field_1).o == 'S')) {
    IVar20 = 0x5a00;
    IVar13 = 0;
    IVar14 = 0;
LAB_00154831:
    (J->fold).ins.field_0.ot = IVar20;
    (J->fold).ins.field_0.op1 = IVar13;
    (J->fold).ins.field_0.op2 = IVar14;
    lj_opt_fold(J);
    pIVar24 = pIVar27;
  }
  goto LAB_00154672;
}

Assistant:

void lj_snap_replay(jit_State *J, GCtrace *T)
{
  SnapShot *snap = &T->snap[J->exitno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  BloomFilter seen = 0;
  int pass23 = 0;
  J->framedepth = 0;
  /* Emit IR for slots inherited from parent snapshot. */
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    BCReg s = snap_slot(sn);
    IRRef ref = snap_ref(sn);
    IRIns *ir = &T->ir[ref];
    TRef tr;
    /* The bloom filter avoids O(nent^2) overhead for de-duping slots. */
    if (bloomtest(seen, ref) && (tr = snap_dedup(J, map, n, ref)) != 0)
      goto setslot;
    bloomset(seen, ref);
    if (irref_isk(ref)) {
      /* See special treatment of LJ_FR2 slot 1 in snapshot_slots() above. */
      if (LJ_FR2 && (sn == SNAP(1, SNAP_FRAME | SNAP_NORESTORE, REF_NIL)))
	tr = 0;
      else
	tr = snap_replay_const(J, ir);
    } else if (!regsp_used(ir->prev)) {
      pass23 = 1;
      lj_assertJ(s != 0, "unused slot 0 in snapshot");
      tr = s;
    } else {
      IRType t = irt_type(ir->t);
      uint32_t mode = IRSLOAD_INHERIT|IRSLOAD_PARENT;
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM)) t = IRT_NUM;
      if (ir->o == IR_SLOAD) mode |= (ir->op2 & IRSLOAD_READONLY);
      if ((sn & SNAP_KEYINDEX)) mode |= IRSLOAD_KEYINDEX;
      tr = emitir_raw(IRT(IR_SLOAD, t), s, mode);
    }
  setslot:
    /* Same as TREF_* flags. */
    J->slot[s] = tr | (sn&(SNAP_KEYINDEX|SNAP_CONT|SNAP_FRAME));
    J->framedepth += ((sn & (SNAP_CONT|SNAP_FRAME)) && (s != LJ_FR2));
    if ((sn & SNAP_FRAME))
      J->baseslot = s+1;
  }
  if (pass23) {
    IRIns *irlast = &T->ir[snap->ref];
    pass23 = 0;
    /* Emit dependent PVALs. */
    for (n = 0; n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) continue;
	pass23 = 1;
	lj_assertJ(ir->o == IR_TNEW || ir->o == IR_TDUP ||
		   ir->o == IR_CNEW || ir->o == IR_CNEWI,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	if (ir->op1 >= T->nk) snap_pref(J, T, map, nent, seen, ir->op1);
	if (ir->op2 >= T->nk) snap_pref(J, T, map, nent, seen, ir->op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP)
	    snap_pref(J, T, map, nent, seen, (ir+1)->op2);
	} else {
	  IRIns *irs;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      if (snap_pref(J, T, map, nent, seen, irs->op2) == 0)
		snap_pref(J, T, map, nent, seen, T->ir[irs->op2].op1);
	      else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
		       irs+1 < irlast && (irs+1)->o == IR_HIOP)
		snap_pref(J, T, map, nent, seen, (irs+1)->op2);
	    }
	}
      } else if (!irref_isk(refp) && !regsp_used(ir->prev)) {
	lj_assertJ(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	J->slot[snap_slot(sn)] = snap_pref(J, T, map, nent, seen, ir->op1);
      }
    }
    /* Replay sunk instructions. */
    for (n = 0; pass23 && n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	TRef op1, op2;
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) {  /* De-dup allocs. */
	  J->slot[snap_slot(sn)] = J->slot[J->slot[snap_slot(sn)]];
	  continue;
	}
	op1 = ir->op1;
	if (op1 >= T->nk) op1 = snap_pref(J, T, map, nent, seen, op1);
	op2 = ir->op2;
	if (op2 >= T->nk) op2 = snap_pref(J, T, map, nent, seen, op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP) {
	    lj_needsplit(J);  /* Emit joining HIOP. */
	    op2 = emitir_raw(IRT(IR_HIOP, IRT_I64), op2,
			     snap_pref(J, T, map, nent, seen, (ir+1)->op2));
	  }
	  J->slot[snap_slot(sn)] = emitir(ir->ot & ~(IRT_MARK|IRT_ISPHI), op1, op2);
	} else {
	  IRIns *irs;
	  TRef tr = emitir(ir->ot, op1, op2);
	  J->slot[snap_slot(sn)] = tr;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      IRIns *irr = &T->ir[irs->op1];
	      TRef val, key = irr->op2, tmp = tr;
	      if (irr->o != IR_FREF) {
		IRIns *irk = &T->ir[key];
		if (irr->o == IR_HREFK)
		  key = lj_ir_kslot(J, snap_replay_const(J, &T->ir[irk->op1]),
				    irk->op2);
		else
		  key = snap_replay_const(J, irk);
		if (irr->o == IR_HREFK || irr->o == IR_AREF) {
		  IRIns *irf = &T->ir[irr->op1];
		  tmp = emitir(irf->ot, tmp, irf->op2);
		}
	      }
	      tmp = emitir(irr->ot, tmp, key);
	      val = snap_pref(J, T, map, nent, seen, irs->op2);
	      if (val == 0) {
		IRIns *irc = &T->ir[irs->op2];
		lj_assertJ(irc->o == IR_CONV && irc->op2 == IRCONV_NUM_INT,
			   "sunk store for parent IR %04d with bad op %d",
			   refp - REF_BIAS, irc->o);
		val = snap_pref(J, T, map, nent, seen, irc->op1);
		val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
	      } else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
			 irs+1 < irlast && (irs+1)->o == IR_HIOP) {
		IRType t = IRT_I64;
		if (LJ_SOFTFP32 && irt_type((irs+1)->t) == IRT_SOFTFP)
		  t = IRT_NUM;
		lj_needsplit(J);
		if (irref_isk(irs->op2) && irref_isk((irs+1)->op2)) {
		  uint64_t k = (uint32_t)T->ir[irs->op2].i +
			       ((uint64_t)T->ir[(irs+1)->op2].i << 32);
		  val = lj_ir_k64(J, t == IRT_I64 ? IR_KINT64 : IR_KNUM, k);
		} else {
		  val = emitir_raw(IRT(IR_HIOP, t), val,
			  snap_pref(J, T, map, nent, seen, (irs+1)->op2));
		}
		tmp = emitir(IRT(irs->o, t), tmp, val);
		continue;
	      }
	      tmp = emitir(irs->ot, tmp, val);
	    } else if (LJ_HASFFI && irs->o == IR_XBAR && ir->o == IR_CNEW) {
	      emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
	    }
	}
      }
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = snap->nslots - J->baseslot;
  lj_snap_add(J);
  if (pass23)  /* Need explicit GC step _after_ initial snapshot. */
    emitir_raw(IRTG(IR_GCSTEP, IRT_NIL), 0, 0);
}